

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_writer.cpp
# Opt level: O1

void __thiscall
duckdb::FixedDecimalColumnWriter::WriteVector
          (FixedDecimalColumnWriter *this,WriteStream *temp_writer,ColumnWriterStatistics *stats_p,
          ColumnWriterPageState *page_state,Vector *input_column,idx_t chunk_start,idx_t chunk_end)

{
  unsigned_long *puVar1;
  idx_t r;
  hugeint_t *val;
  hugeint_t input;
  undefined1 auStack_48 [24];
  
  FlatVector::VerifyFlatVector(input_column);
  if (chunk_start < chunk_end) {
    val = (hugeint_t *)(input_column->data + chunk_start * 0x10);
    do {
      puVar1 = (input_column->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar1 == (unsigned_long *)0x0) ||
         (page_state = (ColumnWriterPageState *)(chunk_start >> 6),
         (puVar1[(long)page_state] >> (chunk_start & 0x3f) & 1) != 0)) {
        FixedDecimalStatistics::Update((FixedDecimalStatistics *)stats_p,val);
        input.upper = (int64_t)auStack_48;
        input.lower = val->upper;
        WriteParquetDecimal((duckdb *)val->lower,input,(data_ptr_t)page_state);
        (**temp_writer->_vptr_WriteStream)(temp_writer,auStack_48,0x10);
      }
      chunk_start = chunk_start + 1;
      val = val + 1;
    } while (chunk_end != chunk_start);
  }
  return;
}

Assistant:

void FixedDecimalColumnWriter::WriteVector(WriteStream &temp_writer, ColumnWriterStatistics *stats_p,
                                           ColumnWriterPageState *page_state, Vector &input_column, idx_t chunk_start,
                                           idx_t chunk_end) {
	auto &mask = FlatVector::Validity(input_column);
	auto *ptr = FlatVector::GetData<hugeint_t>(input_column);
	auto &stats = stats_p->Cast<FixedDecimalStatistics>();

	data_t temp_buffer[16];
	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (mask.RowIsValid(r)) {
			stats.Update(ptr[r]);
			WriteParquetDecimal(ptr[r], temp_buffer);
			temp_writer.WriteData(temp_buffer, 16);
		}
	}
}